

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

void __thiscall ON_ScaleValue::SwapLeftAndRight(ON_ScaleValue *this)

{
  ON_LengthValue *this_00;
  ON_LengthValue *this_01;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ON_wString *src;
  ON_LengthValue t;
  ON_LengthValue OStack_c8;
  ON_ScaleValue local_98;
  
  uVar1 = this->m_left_to_right_scale;
  uVar2 = this->m_right_to_left_scale;
  auVar3._8_4_ = (int)uVar1;
  auVar3._0_8_ = uVar2;
  auVar3._12_4_ = (int)((ulong)uVar1 >> 0x20);
  this->m_left_to_right_scale = (double)uVar2;
  this->m_right_to_left_scale = (double)auVar3._8_8_;
  this_00 = &this->m_left_length;
  ON_LengthValue::ON_LengthValue(&OStack_c8,this_00);
  this_01 = &this->m_right_length;
  ON_LengthValue::operator=(this_00,this_01);
  ON_LengthValue::operator=(this_01,&OStack_c8);
  Create(&local_98,this_00,this_01,None);
  src = ScaleAsString(&local_98);
  ON_wString::operator=(&this->m_scale_as_string,src);
  ~ON_ScaleValue(&local_98);
  ON_LengthValue::~ON_LengthValue(&OStack_c8);
  return;
}

Assistant:

void ON_ScaleValue::SwapLeftAndRight()
{
  double x = m_left_to_right_scale;
  m_left_to_right_scale = m_right_to_left_scale;
  m_right_to_left_scale = x;

  ON_LengthValue t = m_left_length;
  m_left_length = m_right_length;
  m_right_length = t;

  // TODO: properly reverse string
  m_scale_as_string = ON_ScaleValue::Create(m_left_length,m_right_length,ON_ScaleValue::ScaleStringFormat::None).ScaleAsString();
}